

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

LoopEntryPointInfo * __thiscall Js::LoopHeader::GetCurrentEntryPointInfo(LoopHeader *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LoopEntryPointInfo **ppLVar4;
  int iVar5;
  SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  
  this_00 = (this->entryPoints).ptr;
  iVar5 = (this_00->
          super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.count;
  if (iVar5 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x2ff,"(this->entryPoints->Count() > 0)",
                                "this->entryPoints->Count() > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = (this->entryPoints).ptr;
    iVar5 = (this_00->
            super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.count;
  }
  ppLVar4 = JsUtil::ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>::Item
                      ((ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer> *)
                       this_00,iVar5 + -1);
  return *ppLVar4;
}

Assistant:

LoopEntryPointInfo * GetCurrentEntryPointInfo() const
        {
            Assert(this->entryPoints->Count() > 0);
            return this->entryPoints->Item(this->GetCurrentEntryPointIndex());
        }